

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_asformat.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::number::impl::LocalizedNumberFormatterAsFormat::format
          (LocalizedNumberFormatterAsFormat *this,Formattable *obj,UnicodeString *appendTo,
          FieldPosition *pos,UErrorCode *status)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  UFormattedNumberData data;
  UnicodeString local_1c0;
  UFormattedNumberData local_180;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    UFormattedNumberData::UFormattedNumberData(&local_180);
    Formattable::populateDecimalQuantity(obj,&local_180.quantity,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      LocalizedNumberFormatter::formatImpl(&this->fFormatter,&local_180,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        pos->fBeginIndex = 0;
        pos->fEndIndex = 0;
        bVar2 = NumberStringBuilder::nextFieldPosition(&local_180.string,pos,status);
        if (bVar2) {
          sVar1 = (appendTo->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar3 = (appendTo->fUnion).fFields.fLength;
          }
          else {
            iVar3 = (int)sVar1 >> 5;
          }
          if (iVar3 != 0) {
            pos->fBeginIndex = pos->fBeginIndex + iVar3;
            sVar1 = (appendTo->fUnion).fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              iVar3 = (appendTo->fUnion).fFields.fLength;
            }
            else {
              iVar3 = (int)sVar1 >> 5;
            }
            pos->fEndIndex = pos->fEndIndex + iVar3;
          }
        }
        NumberStringBuilder::toTempUnicodeString(&local_1c0,&local_180.string);
        UnicodeString::append(appendTo,&local_1c0);
        UnicodeString::~UnicodeString(&local_1c0);
      }
    }
    UFormattedNumberData::~UFormattedNumberData(&local_180);
  }
  return appendTo;
}

Assistant:

UnicodeString& LocalizedNumberFormatterAsFormat::format(const Formattable& obj, UnicodeString& appendTo,
                                                        FieldPosition& pos, UErrorCode& status) const {
    if (U_FAILURE(status)) { return appendTo; }
    UFormattedNumberData data;
    obj.populateDecimalQuantity(data.quantity, status);
    if (U_FAILURE(status)) {
        return appendTo;
    }
    fFormatter.formatImpl(&data, status);
    if (U_FAILURE(status)) {
        return appendTo;
    }
    // always return first occurrence:
    pos.setBeginIndex(0);
    pos.setEndIndex(0);
    bool found = data.string.nextFieldPosition(pos, status);
    if (found && appendTo.length() != 0) {
        pos.setBeginIndex(pos.getBeginIndex() + appendTo.length());
        pos.setEndIndex(pos.getEndIndex() + appendTo.length());
    }
    appendTo.append(data.string.toTempUnicodeString());
    return appendTo;
}